

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTrajectory.cpp
# Opt level: O3

void __thiscall chrono::ChLinkTrajectory::ArchiveOUT(ChLinkTrajectory *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkTrajectory>(marchive);
  ChLinkLockLock::ArchiveOUT(&this->super_ChLinkLockLock,marchive);
  local_38._value = &this->space_fx;
  local_38._name = "space_fx";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->trajectory_line;
  local_38._name = "trajectory_line";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::geometry::ChLine>
            (marchive,(ChNameValue<std::shared_ptr<chrono::geometry::ChLine>_> *)&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->modulo_s;
  local_38._name = "modulo_s";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  return;
}

Assistant:

void ChLinkTrajectory::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkTrajectory>();

    // serialize parent class
    ChLinkLockLock::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(space_fx);
    marchive << CHNVP(trajectory_line);
    marchive << CHNVP(modulo_s);
}